

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

bool __thiscall MetricsDiscovery::MDHelper::SaveReportsFromStream(MDHelper *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong __new_size;
  bool bVar4;
  uint32_t reportsToRead;
  int local_1c;
  
  if (this->m_Initialized == true) {
    if (((this->m_ConcurrentGroup == (IConcurrentGroupLatest *)0x0) ||
        (this->m_MetricSet == (IMetricSetLatest *)0x0)) || ((this->m_APIMask & 1) == 0)) {
      bVar4 = false;
    }
    else {
      lVar3 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      iVar1 = *(int *)(lVar3 + 0x18);
      __new_size = (ulong)(uint)(iVar1 << 8);
      if ((ulong)((long)(this->m_SavedReportData).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)(this->m_SavedReportData).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start) < __new_size) {
        std::vector<char,_std::allocator<char>_>::resize(&this->m_SavedReportData,__new_size);
        this->m_NumSavedReports = 0;
      }
      local_1c = 0x100 - this->m_NumSavedReports;
      (**(code **)(*(long *)this->m_ConcurrentGroup + 0x28))
                (this->m_ConcurrentGroup,&local_1c,
                 (this->m_SavedReportData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar1 * this->m_NumSavedReports,0);
      uVar2 = this->m_NumSavedReports + local_1c;
      this->m_NumSavedReports = uVar2;
      bVar4 = 0xf < uVar2;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool MDHelper::SaveReportsFromStream( void )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet )
    {
        DebugPrint("Can't GetReportFromStream!\n");
        return false;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("SaveReportsFromStream requires API_TYPE_IOSTREAM!\n");
        return false;
    }

    const uint32_t  cMaxNumReports = 256;
    const uint32_t  cMinNumReports = 16;

    const uint32_t  reportSize = m_MetricSet->GetParams()->RawReportSize;

    if( m_SavedReportData.capacity() < reportSize * cMaxNumReports )
    {
        m_SavedReportData.resize( reportSize * cMaxNumReports );
        m_NumSavedReports = 0;
    }

    uint32_t    reportsToRead = cMaxNumReports - m_NumSavedReports;
    char*       pNextReportData = m_SavedReportData.data() + reportSize * m_NumSavedReports;

    DebugPrint("SaveReportsFromStream: currently have %d reports, reading up to %d more reports.\n", m_NumSavedReports, reportsToRead);

    TCompletionCode res = m_ConcurrentGroup->ReadIoStream(
        &reportsToRead,
        pNextReportData,
        0 );

    if( res == CC_READ_PENDING )
    {
        DebugPrint("CC_READ_PENDING: Read %d reports from the stream.\n", reportsToRead);
    }
    else if( res == CC_OK )
    {
        DebugPrint("CC_OK: Read %d reports from the stream.\n", reportsToRead);
    }
    else
    {
        DebugPrint("Error reading from stream: res = %d\n", (int)res);
    }

    m_NumSavedReports += reportsToRead;

    DebugPrint("SaveReportsFromStream: read %d reports, now there are %d saved reports.\n", reportsToRead, m_NumSavedReports);

    return m_NumSavedReports >= cMinNumReports;
}